

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O1

void __thiscall
Utf8Decode_UnexpectedContinuationBytes_Test::TestBody
          (Utf8Decode_UnexpectedContinuationBytes_Test *this)

{
  allocator_type *paVar1;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<unsigned_char> __l_03;
  allocator_type local_c9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  undefined4 local_ac;
  cpstring local_a8;
  cpstring local_88;
  cpstring local_68;
  cpstring local_48;
  cpstring local_28;
  
  local_ac = CONCAT31(local_ac._1_3_,0x80);
  paVar1 = &local_c9;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_ac;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__l,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_28,&local_c8,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_ac = CONCAT31(local_ac._1_3_,0xbf);
  paVar1 = &local_c9;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_ac;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__l_00,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_48,&local_c8,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_ac = CONCAT22(local_ac._2_2_,0xbf80);
  paVar1 = &local_c9;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_ac;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__l_01,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_68,&local_c8,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_ac = CONCAT13(local_ac._3_1_,0x80bf80);
  paVar1 = &local_c9;
  __l_02._M_len = 3;
  __l_02._M_array = (iterator)&local_ac;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__l_02,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_88,&local_c8,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_ac = 0xbf80bf80;
  paVar1 = &local_c9;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&local_ac;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_c8,__l_03,paVar1);
  (anonymous_namespace)::Utf8Decode::decode_abi_cxx11_
            (&local_a8,&local_c8,(bytes *)0x0,SUB81(paVar1,0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F (Utf8Decode, UnexpectedContinuationBytes) {
    decode_bad (bytes ({0x80}));                   // first continuation byte
    decode_bad (bytes ({0xbf}));                   // last continuation byte
    decode_bad (bytes ({0x80, 0xbf}));             // 2 continuation bytes
    decode_bad (bytes ({0x80, 0xbf, 0x80}));       // 3 continuation bytes
    decode_bad (bytes ({0x80, 0xbf, 0x80, 0xbf})); // 4 continuation bytes
}